

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O3

void __thiscall VcprojGenerator::initLibrarianTool(VcprojGenerator *this)

{
  QString *pQVar1;
  QMakeProject *pQVar2;
  ProStringList *this_00;
  long in_FS_OFFSET;
  QAnyStringView QVar3;
  ProKey local_a8;
  ProString local_78;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = &(this->vcProject).Configuration.librarian.OutputFile;
  QVar3.m_size = (size_t)"$(OutDir)\\";
  QVar3.field_0.m_data_utf8 = (char *)pQVar1;
  QString::assign(QVar3);
  pQVar2 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey(&local_a8,"MSVCPROJ_TARGET");
  QMakeEvaluator::first(&local_78,&pQVar2->super_QMakeEvaluator,&local_a8);
  ProString::toQString(&local_48,&local_78);
  QString::append((QString *)pQVar1);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_78.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_78.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_a8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_a8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar2 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)&local_78,"QMAKE_LIBFLAGS");
  this_00 = QMakeEvaluator::valuesRef(&pQVar2->super_QMakeEvaluator,(ProKey *)&local_78);
  ProStringList::toQStringList((QStringList *)&local_a8,this_00);
  QList<QString>::operator+=
            (&(this->vcProject).Configuration.librarian.AdditionalOptions,
             (QList<QString> *)&local_a8);
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_a8);
  if (&(local_78.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_78.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void VcprojGenerator::initLibrarianTool()
{
    VCConfiguration &conf = vcProject.Configuration;
    conf.librarian.OutputFile = "$(OutDir)\\";
    conf.librarian.OutputFile += project->first("MSVCPROJ_TARGET").toQString();
    conf.librarian.AdditionalOptions += project->values("QMAKE_LIBFLAGS").toQStringList();
}